

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10InvalidMappingToanyPolicyTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section10InvalidMappingToanyPolicyTest8
          (Section10InvalidMappingToanyPolicyTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10InvalidMappingToanyPolicyTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "MappingToanyPolicyCACert",
                               "InvalidMappingToanyPolicyTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "MappingToanyPolicyCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.8";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}